

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O1

Vec_Str_t * Pdr_InvPrintStr(Vec_Int_t *vInv,Vec_Int_t *vCounts)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  int *piVar5;
  Vec_Str_t *pVVar6;
  char *pcVar7;
  Vec_Int_t *__ptr;
  void *__s;
  long lVar8;
  long lVar9;
  int *piVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  size_t sVar15;
  uint uVar16;
  
  pVVar6 = (Vec_Str_t *)malloc(0x10);
  pVVar6->nCap = 1000;
  pVVar6->nSize = 0;
  pcVar7 = (char *)malloc(1000);
  pVVar6->pArray = pcVar7;
  __ptr = Pdr_InvMap(vCounts);
  iVar11 = vCounts->nSize;
  if ((long)iVar11 < 1) {
    uVar13 = 0;
  }
  else {
    lVar8 = 0;
    uVar13 = 0;
    do {
      uVar13 = uVar13 + (vCounts->pArray[lVar8] == 0);
      lVar8 = lVar8 + 1;
    } while (iVar11 != lVar8);
  }
  uVar16 = iVar11 - uVar13;
  piVar4 = vInv->pArray;
  __s = malloc((ulong)uVar16);
  if (0 < (int)uVar16) {
    memset(__s,0x2d,(ulong)(~uVar13 + iVar11) + 1);
  }
  if (0 < *piVar4) {
    iVar11 = 0;
    piVar5 = piVar4;
    do {
      piVar10 = piVar5 + 1;
      iVar2 = *piVar10;
      if (0 < (long)iVar2) {
        lVar8 = 0;
        do {
          uVar13 = piVar5[lVar8 + 2];
          if ((int)uVar13 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x130,"int Abc_LitIsCompl(int)");
          }
          if (__ptr->nSize <= (int)(uVar13 >> 1)) goto LAB_005e6eea;
          lVar8 = lVar8 + 1;
          *(byte *)((long)__s + (long)__ptr->pArray[uVar13 >> 1]) = (byte)uVar13 & 1 ^ 0x31;
        } while (iVar2 != lVar8);
      }
      if (0 < (int)uVar16) {
        uVar13 = pVVar6->nCap;
        iVar2 = pVVar6->nSize;
        pcVar7 = pVVar6->pArray;
        uVar14 = 0;
        do {
          cVar1 = *(char *)((long)__s + uVar14);
          if (iVar2 + (int)uVar14 == uVar13) {
            if ((int)uVar13 < 0x10) {
              if (pcVar7 == (char *)0x0) {
                pcVar7 = (char *)malloc(0x10);
              }
              else {
                pcVar7 = (char *)realloc(pcVar7,0x10);
              }
              uVar13 = 0x10;
            }
            else {
              uVar3 = uVar13 * 2;
              if (SBORROW4(uVar13,uVar3) != 0 < (int)uVar13) {
                uVar13 = uVar3;
                if (pcVar7 == (char *)0x0) {
                  pcVar7 = (char *)malloc((ulong)uVar3);
                }
                else {
                  pcVar7 = (char *)realloc(pcVar7,(ulong)uVar3);
                }
              }
            }
          }
          pcVar7[uVar14 + (long)iVar2] = cVar1;
          uVar14 = uVar14 + 1;
        } while (uVar16 != uVar14);
        pVVar6->nSize = iVar2 + (int)uVar14;
        pVVar6->nCap = uVar13;
        pVVar6->pArray = pcVar7;
      }
      uVar13 = pVVar6->nSize;
      lVar8 = (long)(int)uVar13;
      uVar3 = pVVar6->nCap;
      if (uVar13 == uVar3) {
        if ((int)uVar3 < 0x10) {
          if (pVVar6->pArray == (char *)0x0) {
            pcVar7 = (char *)malloc(0x10);
          }
          else {
            pcVar7 = (char *)realloc(pVVar6->pArray,0x10);
          }
          sVar15 = 0x10;
        }
        else {
          sVar15 = (ulong)uVar3 * 2;
          if ((int)sVar15 <= (int)uVar3) goto LAB_005e6ccf;
          if (pVVar6->pArray == (char *)0x0) {
            pcVar7 = (char *)malloc(sVar15);
          }
          else {
            pcVar7 = (char *)realloc(pVVar6->pArray,sVar15);
          }
        }
        pVVar6->pArray = pcVar7;
        pVVar6->nCap = (int)sVar15;
      }
LAB_005e6ccf:
      pcVar7 = pVVar6->pArray;
      pVVar6->nSize = uVar13 + 1;
      pcVar7[lVar8] = ' ';
      uVar3 = pVVar6->nCap;
      if (uVar13 + 1 == uVar3) {
        if ((int)uVar3 < 0x10) {
          if (pcVar7 == (char *)0x0) {
            pcVar7 = (char *)malloc(0x10);
          }
          else {
            pcVar7 = (char *)realloc(pcVar7,0x10);
          }
          sVar15 = 0x10;
        }
        else {
          sVar15 = (ulong)uVar3 * 2;
          if ((int)sVar15 <= (int)uVar3) goto LAB_005e6d33;
          if (pcVar7 == (char *)0x0) {
            pcVar7 = (char *)malloc(sVar15);
          }
          else {
            pcVar7 = (char *)realloc(pcVar7,sVar15);
          }
        }
        pVVar6->pArray = pcVar7;
        pVVar6->nCap = (int)sVar15;
      }
LAB_005e6d33:
      pcVar7 = pVVar6->pArray;
      uVar12 = (uint)(lVar8 + 2);
      pVVar6->nSize = uVar12;
      pcVar7[lVar8 + 1] = '1';
      uVar3 = pVVar6->nCap;
      if (uVar12 == uVar3) {
        if ((int)uVar3 < 0x10) {
          if (pcVar7 == (char *)0x0) {
            pcVar7 = (char *)malloc(0x10);
          }
          else {
            pcVar7 = (char *)realloc(pcVar7,0x10);
          }
          sVar15 = 0x10;
        }
        else {
          sVar15 = (ulong)uVar3 * 2;
          if ((int)sVar15 <= (int)uVar3) goto LAB_005e6d9a;
          if (pcVar7 == (char *)0x0) {
            pcVar7 = (char *)malloc(sVar15);
          }
          else {
            pcVar7 = (char *)realloc(pcVar7,sVar15);
          }
        }
        pVVar6->pArray = pcVar7;
        pVVar6->nCap = (int)sVar15;
      }
LAB_005e6d9a:
      pVVar6->nSize = uVar13 + 3;
      pVVar6->pArray[lVar8 + 2] = '\n';
      lVar8 = (long)*piVar10;
      if (0 < lVar8) {
        lVar9 = 0;
        do {
          if (piVar5[lVar9 + 2] < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          uVar13 = (uint)piVar5[lVar9 + 2] >> 1;
          if (__ptr->nSize <= (int)uVar13) {
LAB_005e6eea:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          lVar9 = lVar9 + 1;
          *(undefined1 *)((long)__s + (long)__ptr->pArray[uVar13]) = 0x2d;
        } while (lVar8 != lVar9);
      }
      iVar11 = iVar11 + 1;
      piVar5 = piVar10 + lVar8;
    } while (iVar11 < *piVar4);
  }
  uVar13 = pVVar6->nSize;
  uVar16 = pVVar6->nCap;
  if (uVar13 == uVar16) {
    if ((int)uVar16 < 0x10) {
      if (pVVar6->pArray == (char *)0x0) {
        pcVar7 = (char *)malloc(0x10);
      }
      else {
        pcVar7 = (char *)realloc(pVVar6->pArray,0x10);
      }
      sVar15 = 0x10;
    }
    else {
      sVar15 = (ulong)uVar16 * 2;
      if ((int)sVar15 <= (int)uVar16) goto LAB_005e6e90;
      if (pVVar6->pArray == (char *)0x0) {
        pcVar7 = (char *)malloc(sVar15);
      }
      else {
        pcVar7 = (char *)realloc(pVVar6->pArray,sVar15);
      }
    }
    pVVar6->pArray = pcVar7;
    pVVar6->nCap = (int)sVar15;
  }
LAB_005e6e90:
  pVVar6->nSize = uVar13 + 1;
  pVVar6->pArray[(int)uVar13] = '\0';
  if (__s != (void *)0x0) {
    free(__s);
  }
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (int *)0x0;
  }
  if (__ptr != (Vec_Int_t *)0x0) {
    free(__ptr);
  }
  return pVVar6;
}

Assistant:

Vec_Str_t * Pdr_InvPrintStr( Vec_Int_t * vInv, Vec_Int_t * vCounts )
{
    Vec_Str_t * vStr = Vec_StrAlloc( 1000 );
    Vec_Int_t * vMap = Pdr_InvMap( vCounts );
    int nVars = Vec_IntSize(vCounts) - Vec_IntCountZero(vCounts);
    int i, k, * pCube, * pList = Vec_IntArray(vInv);
    char * pBuffer = ABC_ALLOC( char, (size_t)(unsigned)nVars );
    for ( i = 0; i < nVars; i++ )
        pBuffer[i] = '-';
    Pdr_ForEachCube( pList, pCube, i )
    {
        for ( k = 0; k < pCube[0]; k++ )
            pBuffer[Vec_IntEntry(vMap, Abc_Lit2Var(pCube[k+1]))] = '0' + !Abc_LitIsCompl(pCube[k+1]);
        for ( k = 0; k < nVars; k++ )
            Vec_StrPush( vStr, pBuffer[k] );
        Vec_StrPush( vStr, ' ' );
        Vec_StrPush( vStr, '1' );
        Vec_StrPush( vStr, '\n' );
        for ( k = 0; k < pCube[0]; k++ )
            pBuffer[Vec_IntEntry(vMap, Abc_Lit2Var(pCube[k+1]))] = '-';
    }
    Vec_StrPush( vStr, '\0' );
    ABC_FREE( pBuffer );
    Vec_IntFree( vMap );
    return vStr;
}